

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

Fl_Type * Fl_Type_make(char *tn)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Fl_Type *pFVar5;
  long lVar6;
  long lVar7;
  
  reading_file = 1;
  lVar7 = 0x18;
  pFVar5 = (Fl_Type *)0x0;
  do {
    plVar1 = *(long **)((long)&New_Menu[0].text + lVar7);
    if (plVar1 == (long *)0x0) {
      bVar2 = false;
    }
    else {
      pcVar4 = (char *)(**(code **)(*plVar1 + 0x28))(plVar1);
      iVar3 = fl_ascii_strcasecmp(tn,pcVar4);
      lVar6 = *plVar1;
      if (iVar3 != 0) {
        pcVar4 = (char *)(**(code **)(lVar6 + 0x30))(plVar1);
        iVar3 = fl_ascii_strcasecmp(tn,pcVar4);
        bVar2 = false;
        if (iVar3 != 0) goto LAB_001951b3;
        lVar6 = *plVar1;
      }
      pFVar5 = (Fl_Type *)(**(code **)(lVar6 + 0x18))(plVar1);
      bVar2 = true;
    }
LAB_001951b3:
    if ((bVar2) || (lVar7 = lVar7 + 0x38, lVar7 == 0xf30)) {
      reading_file = 0;
      return pFVar5;
    }
  } while( true );
}

Assistant:

Fl_Type *Fl_Type_make(const char *tn) {
  reading_file = 1; // makes labels be null
  Fl_Type *r = 0;
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (!m->user_data()) continue;
    Fl_Type *t = (Fl_Type*)(m->user_data());
    if (!fl_ascii_strcasecmp(tn,t->type_name())) {r = t->make(); break;}
    if (!fl_ascii_strcasecmp(tn,t->alt_type_name())) {r = t->make(); break;}
  }
  reading_file = 0;
  return r;
}